

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O1

bool __thiscall Control::activate(Control *this,bool makeChange,ostream *msgLog)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  Link *pLVar3;
  undefined1 uVar4;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  long *plVar9;
  undefined7 in_register_00000031;
  undefined8 uVar10;
  undefined1 *puVar11;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  string local_108;
  ostream *local_e8;
  double local_e0;
  undefined1 local_d8 [8];
  string linkStr;
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_type *local_78;
  string reason;
  long local_48;
  long lStack_40;
  undefined4 local_34;
  int iVar5;
  
  local_78 = &reason._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  (*(this->link->super_Element)._vptr_Element[3])((undefined1 *)((long)&reason.field_2 + 8));
  plVar6 = (long *)std::__cxx11::string::append(reason.field_2._M_local_buf + 8);
  paVar1 = &local_98.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_98.field_2._M_allocated_capacity = *psVar8;
    local_98.field_2._8_8_ = plVar6[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar8;
    local_98._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_98._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_98,
                              (ulong)(this->link->super_Element).name._M_dataplus._M_p);
  local_d8 = (undefined1  [8])&linkStr._M_string_length;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    linkStr._M_string_length = *psVar8;
    linkStr.field_2._M_allocated_capacity = plVar6[3];
  }
  else {
    linkStr._M_string_length = *psVar8;
    local_d8 = (undefined1  [8])*plVar6;
  }
  linkStr._M_dataplus._M_p = (pointer)plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_34 = (undefined4)CONCAT71(in_register_00000031,makeChange);
  if ((long *)reason.field_2._8_8_ != &local_48) {
    operator_delete((void *)reason.field_2._8_8_);
  }
  switch(*(undefined4 *)&(this->super_Element).field_0x2c) {
  case 0:
    std::operator+(&local_98,&s_TankLevel_abi_cxx11_,&(this->node->super_Element).name);
    break;
  case 1:
    std::operator+(&local_98,&s_PressureLevel_abi_cxx11_,&(this->node->super_Element).name);
    break;
  case 2:
    goto LAB_0012b227;
  case 3:
LAB_0012b227:
    std::__cxx11::string::_M_assign((string *)&local_78);
  default:
    goto switchD_0012b1f8_default;
  }
  std::__cxx11::string::operator=((string *)&local_78,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
switchD_0012b1f8_default:
  reason.field_2._8_8_ = &local_48;
  if (this->status == 2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&linkStr.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   &s_SettingChanged_abi_cxx11_);
    local_e8 = msgLog;
    Utilities::to_string<double>(&local_108,&this->setting);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkStr.field_2._8_8_ != &local_a8) {
      uVar10 = local_a8._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_108._M_string_length + local_b0) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        uVar10 = local_108.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_108._M_string_length + local_b0) goto LAB_0012b2fc;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,linkStr.field_2._8_8_);
    }
    else {
LAB_0012b2fc:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append
                         (linkStr.field_2._M_local_buf + 8,(ulong)local_108._M_dataplus._M_p);
    }
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_48 = *plVar6;
      lStack_40 = puVar7[3];
    }
    else {
      local_48 = *plVar6;
      reason.field_2._8_8_ = (long *)*puVar7;
    }
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)plVar6 = 0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append(reason.field_2._M_local_buf + 8,(ulong)local_78);
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98.field_2._8_8_ = puVar7[3];
      local_98._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_98._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((long *)reason.field_2._8_8_ != &local_48) {
      operator_delete((void *)reason.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkStr.field_2._8_8_ != &local_a8) {
      operator_delete((void *)linkStr.field_2._8_8_);
    }
    pLVar3 = this->link;
    local_e0 = this->setting;
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,local_78,reason._M_dataplus._M_p + (long)local_78);
    iVar5 = (*(pLVar3->super_Element)._vptr_Element[0x1b])
                      (SUB84(local_e0,0),pLVar3,(ulong)(byte)local_34,local_128,local_e8);
    uVar4 = (undefined1)iVar5;
    puVar11 = local_128[0];
    if (local_128[0] == local_118) goto LAB_0012b485;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&linkStr.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   &s_StatusChanged_abi_cxx11_);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               (linkStr.field_2._M_local_buf + 8,
                                (ulong)statusTxt_abi_cxx11_[this->status]._M_dataplus._M_p);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_48 = *plVar9;
      lStack_40 = plVar6[3];
    }
    else {
      local_48 = *plVar9;
      reason.field_2._8_8_ = (long *)*plVar6;
    }
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               (reason.field_2._M_local_buf + 8,(ulong)local_78);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98.field_2._8_8_ = plVar6[3];
      local_98._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_98._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((long *)reason.field_2._8_8_ != &local_48) {
      operator_delete((void *)reason.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkStr.field_2._8_8_ != &local_a8) {
      operator_delete((void *)linkStr.field_2._8_8_);
    }
    pLVar3 = this->link;
    uVar2 = this->status;
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,local_78,reason._M_dataplus._M_p + (long)local_78);
    iVar5 = (*(pLVar3->super_Element)._vptr_Element[0x1a])
                      (pLVar3,(ulong)uVar2,(ulong)(byte)local_34,local_148,msgLog);
    uVar4 = (undefined1)iVar5;
    puVar11 = local_148[0];
    if (local_148[0] == local_138) goto LAB_0012b485;
  }
  operator_delete(puVar11);
LAB_0012b485:
  if (local_d8 != (undefined1  [8])&linkStr._M_string_length) {
    operator_delete((void *)local_d8);
  }
  if (local_78 != &reason._M_string_length) {
    operator_delete(local_78);
  }
  return (bool)uVar4;
}

Assistant:

bool Control::activate(bool makeChange, ostream& msgLog)
{
    bool   result = false;
    string reason = "";
    string linkStr = link->typeStr() + " " + link->name;

    switch (type)
    {
    case TANK_LEVEL:
        reason = s_TankLevel + node->name;
        break;

    case PRESSURE_LEVEL:
        reason = s_PressureLevel + node->name;
        break;

    case ELAPSED_TIME:
        reason = s_ElapsedTime;
        break;

    case TIME_OF_DAY:
        reason = s_TimeOfDay;
        break;
    }

    if ( status != NO_STATUS )
    {
        reason =  linkStr + s_StatusChanged + statusTxt[status] + reason;
        result = link->changeStatus(status, makeChange, reason, msgLog);
    }
    else
    {
        reason = linkStr + s_SettingChanged + Utilities::to_string(setting) +
            reason;
        result = link->changeSetting(setting, makeChange, reason, msgLog);
    }
    return result;
}